

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP.h
# Opt level: O0

void __thiscall ASDCP::TimedText::FrameBuffer::FrameBuffer(FrameBuffer *this)

{
  FrameBuffer *this_local;
  
  ASDCP::FrameBuffer::FrameBuffer(&this->super_FrameBuffer);
  *(undefined ***)this = &PTR__FrameBuffer_00128bf8;
  std::__cxx11::string::string((string *)&this->m_MIMEType);
  memset(this->m_AssetID,0,0x10);
  return;
}

Assistant:

FrameBuffer() { memset(m_AssetID, 0, UUIDlen); }